

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O2

Source_File * get_source_file(char *filename,char **where_to_search)

{
  uint __line;
  char *pcVar1;
  FILE *in;
  Source_Name *name;
  Source_File *pSVar2;
  char **ppcVar3;
  
  if (where_to_search == (char **)0x0) {
    pcVar1 = "where_to_search!=NULL";
    __line = 99;
  }
  else {
    pcVar1 = *where_to_search;
    if (pcVar1 != (char *)0x0) {
      ppcVar3 = where_to_search + 1;
      do {
        pcVar1 = gstr_append(pcVar1,filename);
        in = fopen(pcVar1,"r");
        free(pcVar1);
        if (in != (FILE *)0x0) {
          name = get_source_name(filename,ppcVar3[-1]);
          pSVar2 = extract_source_file((FILE *)in,name);
          if (pSVar2 != (Source_File *)0x0) {
            return pSVar2;
          }
          delete_source_name(name);
        }
        pcVar1 = *ppcVar3;
        ppcVar3 = ppcVar3 + 1;
      } while (pcVar1 != (char *)0x0);
      return (Source_File *)0x0;
    }
    pcVar1 = "*where_to_search!=NULL";
    __line = 100;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/program/program.c"
                ,__line,"struct Source_File *get_source_file(char *, char **)");
}

Assistant:

struct Source_File* get_source_file(char *filename,char **where_to_search)
{
	FILE *in;
	char *temp_name;
	char is_directory=0;
	struct Source_Name *name;
	struct Source_File *file;

	assert(where_to_search!=NULL);
	assert(*where_to_search!=NULL);
	do
	{
		temp_name=gstr_append(*where_to_search,filename);
		in=fopen(temp_name,"r");
		free(temp_name);
		if(in==NULL)
			continue;

		name=get_source_name(filename,*where_to_search);
		file=extract_source_file(in,name);
		if(file!=NULL)
		{
			return file;
		}else
		{
			delete_source_name(name);
		}
	}while(*(++where_to_search));
	return NULL;
}